

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_pack8_int8.h
# Opt level: O3

void __thiscall
ncnn::padding_constant_pack8_int8_sse
          (ncnn *this,Mat *src,Mat *dst,int top,int bottom,int left,int right,int64_t _v)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  
  lVar6 = *(long *)this;
  if (0 < top) {
    iVar7 = 0;
    do {
      uVar4 = (ulong)dst & 0xffffffff;
      if (0 < (int)dst) {
        do {
          src->data = (void *)_v;
          src = (Mat *)&src->refcount;
          uVar2 = (int)uVar4 - 1;
          uVar4 = (ulong)uVar2;
        } while (uVar2 != 0);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != top);
  }
  iVar7 = *(int *)(this + 0x30);
  if (0 < iVar7) {
    iVar1 = *(int *)(this + 0x2c);
    iVar3 = 0;
    do {
      iVar5 = left;
      if (0 < left) {
        do {
          src->data = (void *)_v;
          src = (Mat *)&src->refcount;
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
      if (0 < iVar1) {
        lVar8 = 0;
        lVar9 = 0;
        do {
          (&src->data)[lVar9] = *(int **)(lVar6 + lVar9 * 8);
          lVar9 = lVar9 + 1;
          lVar8 = lVar8 + -8;
        } while (iVar1 != (int)lVar9);
        src = (Mat *)((long)src - lVar8);
        lVar6 = lVar6 - lVar8;
      }
      iVar5 = right;
      if (0 < right) {
        do {
          src->data = (void *)_v;
          src = (Mat *)&src->refcount;
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != iVar7);
  }
  if (0 < bottom) {
    iVar7 = 0;
    do {
      uVar4 = (ulong)dst & 0xffffffff;
      if (0 < (int)dst) {
        do {
          src->data = (void *)_v;
          src = (Mat *)&src->refcount;
          uVar2 = (int)uVar4 - 1;
          uVar4 = (ulong)uVar2;
        } while (uVar2 != 0);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != bottom);
  }
  return;
}

Assistant:

static void padding_constant_pack8_int8_sse(const Mat& src, Mat& dst, int top, int bottom, int left, int right, int64_t _v)
{
    const int64_t* ptr = src;
    int64_t* outptr = dst;

    // fill top
    for (int y = 0; y < top; y++)
    {
        for (int x = 0; x < dst.w; x++)
        {
            *outptr++ = _v;
        }
    }
    // fill center
    for (int y = 0; y < src.h; y++)
    {
        for (int x = 0; x < left; x++)
        {
            *outptr++ = _v;
        }
        for (int x = 0; x < src.w; x++)
        {
            *outptr++ = *ptr++;
        }
        for (int x = 0; x < right; x++)
        {
            *outptr++ = _v;
        }
    }
    // fill bottom
    for (int y = 0; y < bottom; y++)
    {
        for (int x = 0; x < dst.w; x++)
        {
            *outptr++ = _v;
        }
    }
}